

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_overlay.cpp
# Opt level: O0

array<unsigned_long,_2UL> __thiscall Omega_h::Overlay::get_face_cells(Overlay *this,size_t face)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  size_t sVar4;
  ulong local_110;
  size_t i_1;
  size_t i;
  size_t ncells;
  size_t begin_i;
  undefined1 local_e8 [4];
  LO face_i;
  Adj faces2cells;
  size_t face_local;
  Overlay *this_local;
  array<unsigned_long,_2UL> cells;
  
  faces2cells.codes.write_.shared_alloc_.direct_ptr = (void *)face;
  Omega_h::Mesh::get_adj((Adj *)local_e8,&this->mesh,2,3);
  iVar1 = *(int *)((long)&(faces2cells.super_Graph.a2ab.write_.shared_alloc_.alloc)->size +
                  (long)(int)faces2cells.codes.write_.shared_alloc_.direct_ptr * 4);
  local_110 = (long)*(int *)((long)&(faces2cells.super_Graph.a2ab.write_.shared_alloc_.alloc)->size
                            + (long)((int)faces2cells.codes.write_.shared_alloc_.direct_ptr + 1) * 4
                            ) - (long)iVar1;
  for (i_1 = 0; i_1 < local_110; i_1 = i_1 + 1) {
    cells._M_elems[1]._4_4_ = iVar1 + (int)i_1;
    iVar2 = *(int *)((long)&(faces2cells.super_Graph.ab2b.write_.shared_alloc_.alloc)->size +
                    (long)cells._M_elems[1]._4_4_ * 4);
    pvVar3 = std::array<unsigned_long,_2UL>::operator[]
                       ((array<unsigned_long,_2UL> *)&this_local,i_1);
    *pvVar3 = (long)iVar2;
  }
  for (; local_110 < 2; local_110 = local_110 + 1) {
    sVar4 = get_invalid_cell_handle(this);
    pvVar3 = std::array<unsigned_long,_2UL>::operator[]
                       ((array<unsigned_long,_2UL> *)&this_local,local_110);
    *pvVar3 = sVar4;
  }
  Adj::~Adj((Adj *)local_e8);
  return (array<unsigned_long,_2UL>)_this_local;
}

Assistant:

std::array<size_t, 2> Overlay::get_face_cells(size_t face) const {
  std::array<size_t, 2> cells;
  auto faces2cells = mesh.get_adj(FACE, REGION);
  auto face_i = LO(face);
  auto begin_i = size_t(faces2cells.a2ab[face_i]);
  auto ncells = size_t(faces2cells.a2ab[face_i + 1]) - begin_i;
  for (size_t i = 0; i < ncells; ++i) {
    cells[i] = size_t(faces2cells.ab2b[LO(begin_i + i)]);
  }
  for (size_t i = ncells; i < 2; ++i) {
    cells[i] = get_invalid_cell_handle();
  }
  return cells;
}